

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_short> min,WrappedType<unsigned_short> max,float gridSize)

{
  short sVar1;
  Ushort UVar2;
  Ushort UVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  short sVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar25;
  uint uVar26;
  float fVar27;
  deRandom rnd;
  ulong uVar24;
  
  iVar4 = componentCount * 2;
  if (stride != 0) {
    iVar4 = stride;
  }
  iVar5 = iVar4 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  pcVar8 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar27 = (float)max.m_value - (float)min.m_value;
    uVar26 = -(uint)(-fVar27 <= fVar27);
    uVar6 = (uint)((float)(~uVar26 & (uint)-fVar27 | (uint)fVar27 & uVar26) * gridSize);
    uVar26 = 0x400;
    if (0x400 < (ushort)uVar6) {
      uVar26 = uVar6;
    }
    uVar7 = uVar26 & 0xffff;
    uVar9 = iVar4 * 4;
    uVar6 = iVar4 * 5;
    uVar23 = (ulong)(uint)count;
    if (count < 1) {
      uVar23 = 0;
    }
    iVar20 = 4;
    iVar19 = 6;
    uVar22 = 1;
    uVar24 = uVar23;
    uVar13 = uVar9;
    uVar12 = uVar6;
    uVar11 = uVar6;
    uVar10 = uVar6;
    for (uVar16 = 0; uVar16 != uVar23; uVar16 = uVar16 + 1) {
      iVar17 = 4;
      do {
        bVar25 = iVar17 == 0;
        iVar17 = iVar17 + -1;
        if (bVar25) break;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                          (&rnd,min.m_value,max.m_value);
        uVar10 = (uint)UVar2.m_value - (uint)UVar2.m_value % uVar7;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                          (&rnd,(unsigned_short)uVar26,max.m_value - (short)uVar10);
        uVar11 = (uint)UVar2.m_value - (uint)UVar2.m_value % uVar7;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                          (&rnd,min.m_value,max.m_value);
        uVar22 = (uint)UVar2.m_value - (uint)UVar2.m_value % uVar7;
        uVar24 = (ulong)uVar22;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                          (&rnd,(unsigned_short)uVar26,max.m_value - (short)uVar22);
        uVar12 = (uint)UVar2.m_value - (uint)UVar2.m_value % uVar7;
        if (componentCount < 3) {
          uVar13 = 1;
          uVar22 = 0;
          break;
        }
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                          (&rnd,min.m_value,max.m_value);
        uVar13 = 1;
        if (componentCount != 3) {
          UVar3 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                            (&rnd,min.m_value,max.m_value);
          uVar13 = (uint)UVar3.m_value - (uint)UVar3.m_value % (uVar26 & 0xffff);
        }
        uVar22 = (uint)UVar2.m_value - (uint)UVar2.m_value % (uVar26 & 0xffff);
      } while (((uVar22 & 0xffff) + (uVar11 & 0xffff) < uVar7) ||
              ((uVar13 & 0xffff) + (uVar12 & 0xffff) < uVar7));
      iVar17 = iVar5 * (int)uVar16;
      sVar1 = (short)uVar10;
      sVar14 = (short)uVar11 + sVar1;
      *(short *)(pcVar8 + (long)iVar17 + (long)offset) = sVar1;
      sVar21 = (short)uVar24;
      *(short *)(pcVar8 + (long)(iVar17 + 2) + (long)offset) = sVar21;
      *(short *)(pcVar8 + (long)(iVar17 + iVar4) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(iVar17 + 2 + iVar4) + (long)offset) = sVar21;
      sVar18 = (short)uVar12 + sVar21;
      *(short *)(pcVar8 + (long)(iVar17 + iVar4 * 2) + (long)offset) = sVar1;
      *(short *)(pcVar8 + (long)(iVar17 + 2 + iVar4 * 2) + (long)offset) = sVar18;
      *(short *)(pcVar8 + (long)(iVar17 + iVar4 * 3) + (long)offset) = sVar1;
      *(short *)(pcVar8 + (long)(iVar17 + 2 + iVar4 * 3) + (long)offset) = sVar18;
      *(short *)(pcVar8 + (long)(int)(iVar17 + uVar9) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(int)(iVar17 + 2 + uVar9) + (long)offset) = sVar21;
      *(short *)(pcVar8 + (long)(int)(iVar17 + uVar6) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(int)(iVar17 + uVar6 + 2) + (long)offset) = sVar18;
      if (2 < componentCount) {
        lVar15 = 6;
        iVar17 = iVar20;
        while (bVar25 = lVar15 != 0, lVar15 = lVar15 + -1, bVar25) {
          *(short *)(pcVar8 + (long)iVar17 + (long)offset) = (short)uVar22;
          iVar17 = iVar17 + iVar4;
        }
        if (componentCount != 3) {
          lVar15 = 6;
          iVar17 = iVar19;
          while (bVar25 = lVar15 != 0, lVar15 = lVar15 + -1, bVar25) {
            *(short *)(pcVar8 + (long)iVar17 + (long)offset) = (short)uVar13;
            iVar17 = iVar17 + iVar4;
          }
        }
      }
      iVar20 = iVar20 + iVar5;
      iVar19 = iVar19 + iVar5;
    }
  }
  return pcVar8;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}